

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool ConnectionDone(SessionHandle *data,connectdata *conn)

{
  ulong local_30;
  connectdata *local_28;
  connectdata *conn_candidate;
  size_t maxconnects;
  connectdata *conn_local;
  SessionHandle *data_local;
  
  if (data->multi->maxconnects < 0) {
    local_30 = (ulong)(data->multi->num_easy << 2);
  }
  else {
    local_30 = data->multi->maxconnects;
  }
  local_28 = (connectdata *)0x0;
  conn->inuse = false;
  if ((local_30 != 0) && (local_30 < ((data->state).conn_cache)->num_connections)) {
    Curl_infof(data,"Connection cache is full, closing the oldest one.\n");
    local_28 = find_oldest_idle_connection(data);
    if (local_28 != (connectdata *)0x0) {
      local_28->data = data;
      Curl_disconnect(local_28,false);
    }
  }
  return local_28 != conn;
}

Assistant:

static bool
ConnectionDone(struct SessionHandle *data, struct connectdata *conn)
{
  /* data->multi->maxconnects can be negative, deal with it. */
  size_t maxconnects =
    (data->multi->maxconnects < 0) ? data->multi->num_easy * 4:
    data->multi->maxconnects;
  struct connectdata *conn_candidate = NULL;

  /* Mark the current connection as 'unused' */
  conn->inuse = FALSE;

  if(maxconnects > 0 &&
     data->state.conn_cache->num_connections > maxconnects) {
    infof(data, "Connection cache is full, closing the oldest one.\n");

    conn_candidate = find_oldest_idle_connection(data);

    if(conn_candidate) {
      /* Set the connection's owner correctly */
      conn_candidate->data = data;

      /* the winner gets the honour of being disconnected */
      (void)Curl_disconnect(conn_candidate, /* dead_connection */ FALSE);
    }
  }

  return (conn_candidate == conn) ? FALSE : TRUE;
}